

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

char * xmlParserGetDirectory(char *filename)

{
  size_t sVar1;
  char **local_430;
  char *cur;
  char dir [1024];
  char *local_20;
  char *ret;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    strncpy((char *)&cur,filename,0x3ff);
    dir[0x3f7] = '\0';
    sVar1 = strlen((char *)&cur);
    for (local_430 = (char **)(dir + (sVar1 - 8)); (&cur < local_430 && (*(char *)local_430 != '/'))
        ; local_430 = (char **)((long)local_430 + -1)) {
    }
    if (*(char *)local_430 == '/') {
      if (local_430 == &cur) {
        cur._1_1_ = 0;
      }
      else {
        *(char *)local_430 = '\0';
      }
      local_20 = (*xmlMemStrdup)((char *)&cur);
    }
    else {
      local_20 = (*xmlMemStrdup)(".");
    }
    filename_local = local_20;
  }
  return filename_local;
}

Assistant:

char *
xmlParserGetDirectory(const char *filename) {
    char *ret = NULL;
    char dir[1024];
    char *cur;

    if (filename == NULL) return(NULL);

#if defined(_WIN32)
#   define IS_XMLPGD_SEP(ch) ((ch=='/')||(ch=='\\'))
#else
#   define IS_XMLPGD_SEP(ch) (ch=='/')
#endif

    strncpy(dir, filename, 1023);
    dir[1023] = 0;
    cur = &dir[strlen(dir)];
    while (cur > dir) {
         if (IS_XMLPGD_SEP(*cur)) break;
	 cur --;
    }
    if (IS_XMLPGD_SEP(*cur)) {
        if (cur == dir) dir[1] = 0;
	else *cur = 0;
	ret = xmlMemStrdup(dir);
    } else {
        ret = xmlMemStrdup(".");
    }
    return(ret);
#undef IS_XMLPGD_SEP
}